

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t gc_onestep(lua_State *L)

{
  GCRef *p;
  lua_State *L_00;
  GCRef *pGVar1;
  global_State *in_RDI;
  MSize old_1;
  MSize old;
  global_State *g;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t uVar2;
  uint32_t in_stack_ffffffffffffffe4;
  size_t local_8;
  
  p = (GCRef *)(ulong)in_RDI->strmask;
  L_00 = (lua_State *)(ulong)*(byte *)((long)&p[10].gcptr32 + 1);
  switch(L_00) {
  case (lua_State *)0x0:
    gc_mark_start((global_State *)0x109e5b);
    local_8 = 0;
    break;
  case (lua_State *)0x1:
    if (p[0xe].gcptr32 == 0) {
      *(undefined1 *)((long)&p[10].gcptr32 + 1) = 2;
      local_8 = 0;
    }
    else {
      local_8 = propagatemark((global_State *)L);
    }
    break;
  case (lua_State *)0x2:
    if (p[0x3d].gcptr32 == 0) {
      atomic((global_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),L_00);
      *(undefined1 *)((long)&p[10].gcptr32 + 1) = 3;
      p[0xb].gcptr32 = 0;
      local_8 = 0;
    }
    else {
      local_8 = 0x7fffff00;
    }
    break;
  case (lua_State *)0x3:
    uVar2 = p[8].gcptr32;
    p[0xb].gcptr32 = p[0xb].gcptr32 + 1;
    gc_sweep(in_RDI,p,uVar2);
    if (p[2].gcptr32 < p[0xb].gcptr32) {
      *(undefined1 *)((long)&p[10].gcptr32 + 1) = 4;
    }
    p[0x14].gcptr32 = p[0x14].gcptr32 - (uVar2 - p[8].gcptr32);
    local_8 = 10;
    break;
  case (lua_State *)0x4:
    uVar2 = p[8].gcptr32;
    pGVar1 = gc_sweep(in_RDI,p,in_stack_ffffffffffffffe4);
    p[0xd].gcptr32 = (uint32_t)pGVar1;
    p[0x14].gcptr32 = p[0x14].gcptr32 - (uVar2 - p[8].gcptr32);
    if (*(int *)(ulong)p[0xd].gcptr32 == 0) {
      gc_shrink((global_State *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),L_00);
      if (p[0x11].gcptr32 == 0) {
        *(undefined1 *)((long)&p[10].gcptr32 + 1) = 0;
        p[0x13].gcptr32 = 0;
      }
      else {
        *(undefined1 *)((long)&p[10].gcptr32 + 1) = 5;
        *(undefined1 *)((long)&p[10].gcptr32 + 2) = 1;
      }
    }
    local_8 = 400;
    break;
  case (lua_State *)0x5:
    if (p[0x11].gcptr32 == 0) {
      if (*(char *)((long)&p[10].gcptr32 + 2) == '\0') {
        lj_tab_rehash((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (GCtab *)L_00);
      }
      *(undefined1 *)((long)&p[10].gcptr32 + 1) = 0;
      p[0x13].gcptr32 = 0;
      local_8 = 0;
    }
    else if (p[0x3d].gcptr32 == 0) {
      gc_finalize((lua_State *)g);
      if (100 < p[0x14].gcptr32) {
        p[0x14].gcptr32 = p[0x14].gcptr32 - 100;
      }
      local_8 = 100;
    }
    else {
      local_8 = 0x7fffff00;
    }
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (gcref(g->jit_L))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    MSize old = g->gc.total;
    gc_fullsweep(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    MSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      gc_shrink(g, L);
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (gcref(g->jit_L))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lua_assert(0);
    return 0;
  }
}